

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sighash_tests.cpp
# Opt level: O2

void __thiscall sighash_tests::sighash_from_data::test_method(sighash_from_data *this)

{
  long lVar1;
  uint uVar2;
  __type_conflict _Var3;
  uint nIn;
  uint nHashType;
  UniValue *pUVar4;
  long lVar5;
  UniValue *pUVar6;
  string *psVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  DataStream *this_00;
  uint uVar11;
  long in_FS_OFFSET;
  string_view jsondata;
  const_string file;
  string_view hex_str;
  Span<const_std::byte> sp;
  const_string file_00;
  const_string file_01;
  string_view hex_str_00;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar12;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  assertion_result local_240;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  DataStream stream;
  CTransactionRef tx;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  TxValidationState state;
  undefined1 local_158 [28];
  uint uStack_13c;
  uint256 sh;
  string sigHashHex;
  string raw_script;
  string raw_tx;
  string strTest;
  UniValue tests;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  jsondata._M_str = json_tests::detail_sighash_bytes;
  jsondata._M_len = 0x33633;
  read_json(&tests,jsondata);
  uVar11 = 0;
  while( true ) {
    if ((ulong)(((long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar11) break;
    pUVar4 = UniValue::operator[](&tests,(ulong)uVar11);
    UniValue::write_abi_cxx11_((UniValue *)&strTest,(int)pUVar4,(void *)0x0,0);
    lVar5 = ((long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x58;
    if (lVar5 != 1) {
      if (lVar5 == 0) {
        local_1b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
        ;
        local_1a8 = "";
        local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
        file.m_end = (iterator)0xad;
        file.m_begin = (iterator)&local_1b0;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,
                   msg);
        raw_script._M_dataplus._M_p = raw_script._M_dataplus._M_p & 0xffffffffffffff00;
        raw_script._M_string_length = 0;
        raw_script.field_2._M_allocated_capacity = 0;
        raw_tx._M_string_length = raw_tx._M_string_length & 0xffffffffffffff00;
        raw_tx._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01147bd8;
        raw_tx.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
        raw_tx.field_2._8_8_ = anon_var_dwarf_259747;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p &
             0xffffffffffffff00;
        state.super_ValidationState<TxValidationResult>._0_8_ = &PTR__lazy_ostream_01147c18;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
             (size_type)&raw_tx;
        state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)&strTest;
        local_1d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
        ;
        local_1c8 = "";
        in_R8 = &DAT_00000001;
        in_R9 = &DAT_00000001;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&raw_script,(lazy_ostream *)&state,1,1,WARN,_cVar12,
                   (size_t)&local_1d0,0xad);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&raw_script.field_2._M_allocated_capacity);
      }
      else {
        raw_tx._M_dataplus._M_p = (pointer)&raw_tx.field_2;
        raw_tx._M_string_length = 0;
        raw_script._M_dataplus._M_p = (pointer)&raw_script.field_2;
        raw_script._M_string_length = 0;
        sigHashHex._M_dataplus._M_p = (pointer)&sigHashHex.field_2;
        sigHashHex._M_string_length = 0;
        raw_tx.field_2._M_allocated_capacity =
             raw_tx.field_2._M_allocated_capacity & 0xffffffffffffff00;
        raw_script.field_2._M_allocated_capacity =
             raw_script.field_2._M_allocated_capacity & 0xffffffffffffff00;
        sigHashHex.field_2._M_local_buf[0] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        sh.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_158._16_8_ = 0;
        stack0xfffffffffffffec0 = 0;
        local_158._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
        local_158._8_8_ = 0;
        pUVar6 = UniValue::operator[](pUVar4,0);
        psVar7 = UniValue::get_str_abi_cxx11_(pUVar6);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&raw_tx,psVar7);
        pUVar6 = UniValue::operator[](pUVar4,1);
        psVar7 = UniValue::get_str_abi_cxx11_(pUVar6);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&raw_script,psVar7);
        pUVar6 = UniValue::operator[](pUVar4,2);
        nIn = UniValue::getInt<int>(pUVar6);
        pUVar6 = UniValue::operator[](pUVar4,3);
        nHashType = UniValue::getInt<int>(pUVar6);
        pUVar4 = UniValue::operator[](pUVar4,4);
        psVar7 = UniValue::get_str_abi_cxx11_(pUVar4);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&sigHashHex,psVar7);
        hex_str._M_str = raw_tx._M_dataplus._M_p;
        hex_str._M_len = raw_tx._M_string_length;
        ParseHex<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&state,hex_str);
        sp.m_size = (long)state.super_ValidationState<TxValidationResult>.m_reject_reason.
                          _M_dataplus._M_p - state.super_ValidationState<TxValidationResult>._0_8_;
        sp.m_data = (byte *)state.super_ValidationState<TxValidationResult>._0_8_;
        DataStream::DataStream(&stream,sp);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&state);
        state.super_ValidationState<TxValidationResult>._0_8_ = &::TX_WITH_WITNESS;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)&tx;
        ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>::
        Unserialize<DataStream>
                  ((ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)
                   &state,&stream);
        state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
        state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)&state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
        state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
        state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity =
             state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
             _M_allocated_capacity & 0xffffffffffffff00;
        state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)&state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
        state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
        state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] =
             '\0';
        local_218 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
        ;
        local_210 = "";
        local_228 = &boost::unit_test::basic_cstring<char_const>::null;
        local_220 = &boost::unit_test::basic_cstring<char_const>::null;
        file_00.m_end = (iterator)0xc4;
        file_00.m_begin = (iterator)&local_218;
        msg_00.m_end = in_R9;
        msg_00.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_228
                   ,msg_00);
        local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             CheckTransaction(tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,&state);
        local_240.m_message.px = (element_type *)0x0;
        local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
        raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01147fb0;
        raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
        local_270 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
        ;
        local_268 = "";
        pvVar9 = &DAT_00000001;
        pvVar10 = &DAT_00000001;
        boost::test_tools::tt_detail::report_assertion
                  (&local_240,(lazy_ostream *)&raw,1,1,WARN,_cVar12,(size_t)&local_270,0xc4);
        boost::detail::shared_count::~shared_count(&local_240.m_message.pn);
        local_280 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
        ;
        local_278 = "";
        local_290 = &boost::unit_test::basic_cstring<char_const>::null;
        local_288 = &boost::unit_test::basic_cstring<char_const>::null;
        file_01.m_end = (iterator)0xc5;
        file_01.m_begin = (iterator)&local_280;
        msg_01.m_end = pvVar10;
        msg_01.m_begin = pvVar9;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_290
                   ,msg_01);
        local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             (state.super_ValidationState<TxValidationResult>.m_mode == M_VALID);
        local_240.m_message.px = (element_type *)0x0;
        local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_2a0 = "state.IsValid()";
        local_298 = "";
        raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
        raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
        local_2b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
        ;
        local_2a8 = "";
        boost::test_tools::tt_detail::report_assertion
                  (&local_240,(lazy_ostream *)&raw,1,0,WARN,_cVar12,(size_t)&local_2b0,0xc5);
        boost::detail::shared_count::~shared_count(&local_240.m_message.pn);
        hex_str_00._M_str = raw_script._M_dataplus._M_p;
        hex_str_00._M_len = raw_script._M_string_length;
        ParseHex<unsigned_char>(&raw,hex_str_00);
        uVar2 = uStack_13c - 0x1d;
        if (uStack_13c < 0x1d) {
          uVar2 = uStack_13c;
        }
        ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_158._0_8_;
        if (uStack_13c < 0x1d) {
          ppVar8 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_158;
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_158,
                   (uchar *)((long)&ppVar8->_union + (long)(int)uVar2),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        ValidationState<TxValidationResult>::~ValidationState
                  (&state.super_ValidationState<TxValidationResult>);
        this_00 = &stream;
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)this_00);
        stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _cVar12 = CHECK_PRED;
        pvVar9 = (iterator)(ulong)nHashType;
        SignatureHash<CTransaction>
                  ((uint256 *)&state.super_ValidationState<TxValidationResult>,(CScript *)local_158,
                   tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr,nIn,
                   nHashType,(CAmount *)this_00,BASE,(PrecomputedTransactionData *)0x0);
        sh.super_base_blob<256U>.m_data._M_elems[0x10] =
             (undefined1)
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length;
        sh.super_base_blob<256U>.m_data._M_elems[0x11] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._1_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x12] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._2_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x13] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._3_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x14] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x15] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._5_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x16] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._6_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x17] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._7_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x18] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._0_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x19] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._1_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x1a] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._2_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x1b] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._3_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x1c] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._4_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x1d] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._5_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x1e] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._6_1_;
        sh.super_base_blob<256U>.m_data._M_elems[0x1f] =
             state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._7_1_;
        sh.super_base_blob<256U>.m_data._M_elems._0_8_ =
             state.super_ValidationState<TxValidationResult>._0_8_;
        sh.super_base_blob<256U>.m_data._M_elems._8_8_ =
             state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p;
        local_2f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
        ;
        local_2e8 = "";
        local_300 = &boost::unit_test::basic_cstring<char_const>::null;
        local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_02.m_end = (iterator)0xcf;
        file_02.m_begin = (iterator)&local_2f0;
        msg_02.m_end = (iterator)this_00;
        msg_02.m_begin = pvVar9;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_300
                   ,msg_02);
        base_blob<256u>::GetHex_abi_cxx11_((string *)&state,(base_blob<256u> *)&sh);
        _Var3 = std::operator==((string *)&state,&sigHashHex);
        raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,_Var3);
        raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01147fb0;
        stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
        local_310 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
        ;
        local_308 = "";
        in_R8 = &DAT_00000001;
        in_R9 = &DAT_00000001;
        stream.m_read_pos = (size_type)&strTest;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&raw,(lazy_ostream *)&stream,1,1,WARN,_cVar12,
                   (size_t)&local_310,0xcf);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&state);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_158);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&sigHashHex);
        std::__cxx11::string::~string((string *)&raw_script);
        std::__cxx11::string::~string((string *)&raw_tx);
      }
    }
    std::__cxx11::string::~string((string *)&strTest);
    uVar11 = uVar11 + 1;
  }
  UniValue::~UniValue(&tests);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sighash_from_data)
{
    UniValue tests = read_json(json_tests::sighash);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test.size() < 1) // Allow for extra stuff (useful for comments)
        {
            BOOST_ERROR("Bad test: " << strTest);
            continue;
        }
        if (test.size() == 1) continue; // comment

        std::string raw_tx, raw_script, sigHashHex;
        int nIn, nHashType;
        uint256 sh;
        CTransactionRef tx;
        CScript scriptCode = CScript();

        try {
          // deserialize test data
          raw_tx = test[0].get_str();
          raw_script = test[1].get_str();
          nIn = test[2].getInt<int>();
          nHashType = test[3].getInt<int>();
          sigHashHex = test[4].get_str();

          DataStream stream(ParseHex(raw_tx));
          stream >> TX_WITH_WITNESS(tx);

          TxValidationState state;
          BOOST_CHECK_MESSAGE(CheckTransaction(*tx, state), strTest);
          BOOST_CHECK(state.IsValid());

          std::vector<unsigned char> raw = ParseHex(raw_script);
          scriptCode.insert(scriptCode.end(), raw.begin(), raw.end());
        } catch (...) {
          BOOST_ERROR("Bad test, couldn't deserialize data: " << strTest);
          continue;
        }

        sh = SignatureHash(scriptCode, *tx, nIn, nHashType, 0, SigVersion::BASE);
        BOOST_CHECK_MESSAGE(sh.GetHex() == sigHashHex, strTest);
    }
}